

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [32];
  byte bVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  AABBNodeMB4D *node1;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar50;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar70 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar71 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar72;
  float fVar85;
  float fVar86;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar88;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [64];
  float fVar111;
  float fVar113;
  uint uVar114;
  float fVar115;
  uint uVar116;
  float fVar117;
  uint uVar118;
  undefined1 auVar112 [64];
  float fVar119;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar128 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_1528;
  undefined8 uStack_1520;
  int local_14fc;
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [8];
  float fStack_14d0;
  float fStack_14cc;
  undefined1 local_14c8 [8];
  float fStack_14c0;
  float fStack_14bc;
  undefined1 local_14b8 [16];
  Scene *local_14a8;
  long local_14a0;
  undefined1 local_1498 [8];
  float fStack_1490;
  float fStack_148c;
  ulong local_1480;
  ulong *local_1478;
  long local_1470;
  ulong local_1468;
  ulong local_1460;
  uint local_1458;
  uint local_1454;
  uint local_1450;
  undefined4 local_144c;
  float local_1448;
  undefined4 local_1444;
  uint local_1440;
  uint local_143c;
  uint local_1438;
  RTCFilterFunctionNArguments local_1428;
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [8];
  float fStack_13e0;
  float fStack_13dc;
  undefined1 local_13d8 [8];
  float fStack_13d0;
  float fStack_13cc;
  undefined1 local_13c8 [8];
  float fStack_13c0;
  float fStack_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar50 = ray->tfar;
    auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar50) {
      local_1478 = local_11d0;
      aVar5 = (ray->dir).field_0;
      auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      auVar51 = vandps_avx((undefined1  [16])aVar5,auVar51);
      auVar98._8_4_ = 0x219392ef;
      auVar98._0_8_ = 0x219392ef219392ef;
      auVar98._12_4_ = 0x219392ef;
      auVar51 = vcmpps_avx(auVar51,auVar98,1);
      auVar51 = vblendvps_avx((undefined1  [16])aVar5,auVar98,auVar51);
      auVar98 = vrcpps_avx(auVar51);
      fVar57 = auVar98._0_4_;
      auVar73._0_4_ = fVar57 * auVar51._0_4_;
      fVar58 = auVar98._4_4_;
      auVar73._4_4_ = fVar58 * auVar51._4_4_;
      fVar59 = auVar98._8_4_;
      auVar73._8_4_ = fVar59 * auVar51._8_4_;
      fVar96 = auVar98._12_4_;
      auVar73._12_4_ = fVar96 * auVar51._12_4_;
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar51 = vsubps_avx(auVar99,auVar73);
      auVar74._0_4_ = fVar57 + fVar57 * auVar51._0_4_;
      auVar74._4_4_ = fVar58 + fVar58 * auVar51._4_4_;
      auVar74._8_4_ = fVar59 + fVar59 * auVar51._8_4_;
      auVar74._12_4_ = fVar96 + fVar96 * auVar51._12_4_;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar4;
      local_11f8._0_4_ = uVar4;
      local_11f8._8_4_ = uVar4;
      local_11f8._12_4_ = uVar4;
      local_11f8._16_4_ = uVar4;
      local_11f8._20_4_ = uVar4;
      local_11f8._24_4_ = uVar4;
      local_11f8._28_4_ = uVar4;
      auVar107 = ZEXT3264(local_11f8);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar4;
      local_1218._0_4_ = uVar4;
      local_1218._8_4_ = uVar4;
      local_1218._12_4_ = uVar4;
      local_1218._16_4_ = uVar4;
      local_1218._20_4_ = uVar4;
      local_1218._24_4_ = uVar4;
      local_1218._28_4_ = uVar4;
      auVar108 = ZEXT3264(local_1218);
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar4;
      local_1238._0_4_ = uVar4;
      local_1238._8_4_ = uVar4;
      local_1238._12_4_ = uVar4;
      local_1238._16_4_ = uVar4;
      local_1238._20_4_ = uVar4;
      local_1238._24_4_ = uVar4;
      local_1238._28_4_ = uVar4;
      auVar110 = ZEXT3264(local_1238);
      auVar51 = vshufps_avx(auVar74,auVar74,0);
      local_1258._16_16_ = auVar51;
      local_1258._0_16_ = auVar51;
      auVar112 = ZEXT3264(local_1258);
      auVar51 = vmovshdup_avx(auVar74);
      auVar93 = ZEXT1664(auVar51);
      auVar98 = vshufps_avx(auVar74,auVar74,0x55);
      local_1278._16_16_ = auVar98;
      local_1278._0_16_ = auVar98;
      auVar120 = ZEXT3264(local_1278);
      auVar98 = vshufpd_avx(auVar74,auVar74,1);
      auVar103 = ZEXT1664(auVar98);
      auVar73 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar84 = ZEXT1664(auVar73);
      local_1298._16_16_ = auVar73;
      local_1298._0_16_ = auVar73;
      auVar125 = ZEXT3264(local_1298);
      uVar45 = (ulong)(auVar74._0_4_ < 0.0) << 5;
      uVar48 = (ulong)(auVar51._0_4_ < 0.0) << 5 | 0x40;
      uVar39 = (ulong)(auVar98._0_4_ < 0.0) << 5 | 0x80;
      auVar51 = vshufps_avx(auVar54,auVar54,0);
      auVar71 = ZEXT1664(auVar51);
      local_12b8._16_16_ = auVar51;
      local_12b8._0_16_ = auVar51;
      auVar127 = ZEXT3264(local_12b8);
      auVar51 = vshufps_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),0);
      local_12d8._16_16_ = auVar51;
      local_12d8._0_16_ = auVar51;
      auVar128 = ZEXT3264(local_12d8);
      local_13f8 = mm_lookupmask_ps._240_16_;
      local_1480 = uVar45;
      uVar38 = uVar45;
LAB_002e70c5:
      do {
        uVar49 = local_1478[-1];
        local_1478 = local_1478 + -1;
        while ((uVar49 & 8) == 0) {
          uVar34 = uVar49 & 0xfffffffffffffff0;
          fVar50 = (ray->dir).field_0.m128[3];
          auVar56._4_4_ = fVar50;
          auVar56._0_4_ = fVar50;
          auVar56._8_4_ = fVar50;
          auVar56._12_4_ = fVar50;
          auVar56._16_4_ = fVar50;
          auVar56._20_4_ = fVar50;
          auVar56._24_4_ = fVar50;
          auVar56._28_4_ = fVar50;
          pfVar3 = (float *)(uVar34 + 0x100 + uVar38);
          pfVar1 = (float *)(uVar34 + 0x40 + uVar38);
          auVar70._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar70._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar70._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar70._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar70._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar70._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar70._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar70._28_4_ = auVar71._28_4_ + pfVar1[7];
          auVar70 = vsubps_avx(auVar70,auVar107._0_32_);
          auVar23._4_4_ = auVar112._4_4_ * auVar70._4_4_;
          auVar23._0_4_ = auVar112._0_4_ * auVar70._0_4_;
          auVar23._8_4_ = auVar112._8_4_ * auVar70._8_4_;
          auVar23._12_4_ = auVar112._12_4_ * auVar70._12_4_;
          auVar23._16_4_ = auVar112._16_4_ * auVar70._16_4_;
          auVar23._20_4_ = auVar112._20_4_ * auVar70._20_4_;
          auVar23._24_4_ = auVar112._24_4_ * auVar70._24_4_;
          auVar23._28_4_ = auVar70._28_4_;
          auVar70 = vmaxps_avx(auVar127._0_32_,auVar23);
          pfVar3 = (float *)(uVar34 + 0x100 + uVar48);
          pfVar1 = (float *)(uVar34 + 0x40 + uVar48);
          auVar82._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar82._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar82._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar82._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar82._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar82._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar82._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar82._28_4_ = auVar84._28_4_ + pfVar1[7];
          auVar23 = vsubps_avx(auVar82,auVar108._0_32_);
          auVar25._4_4_ = auVar120._4_4_ * auVar23._4_4_;
          auVar25._0_4_ = auVar120._0_4_ * auVar23._0_4_;
          auVar25._8_4_ = auVar120._8_4_ * auVar23._8_4_;
          auVar25._12_4_ = auVar120._12_4_ * auVar23._12_4_;
          auVar25._16_4_ = auVar120._16_4_ * auVar23._16_4_;
          auVar25._20_4_ = auVar120._20_4_ * auVar23._20_4_;
          auVar25._24_4_ = auVar120._24_4_ * auVar23._24_4_;
          auVar25._28_4_ = auVar23._28_4_;
          pfVar3 = (float *)(uVar34 + 0x100 + uVar39);
          pfVar1 = (float *)(uVar34 + 0x40 + uVar39);
          auVar91._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar91._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar91._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar91._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar91._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar91._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar91._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar91._28_4_ = auVar93._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar91,auVar110._0_32_);
          auVar26._4_4_ = auVar125._4_4_ * auVar82._4_4_;
          auVar26._0_4_ = auVar125._0_4_ * auVar82._0_4_;
          auVar26._8_4_ = auVar125._8_4_ * auVar82._8_4_;
          auVar26._12_4_ = auVar125._12_4_ * auVar82._12_4_;
          auVar26._16_4_ = auVar125._16_4_ * auVar82._16_4_;
          auVar26._20_4_ = auVar125._20_4_ * auVar82._20_4_;
          auVar26._24_4_ = auVar125._24_4_ * auVar82._24_4_;
          auVar26._28_4_ = auVar82._28_4_;
          auVar23 = vmaxps_avx(auVar25,auVar26);
          auVar70 = vmaxps_avx(auVar70,auVar23);
          pfVar3 = (float *)(uVar34 + 0x100 + (uVar45 ^ 0x20));
          pfVar1 = (float *)(uVar34 + 0x40 + (uVar45 ^ 0x20));
          auVar83._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar83._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar83._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar83._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar83._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar83._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar83._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar83._28_4_ = auVar23._28_4_ + pfVar1[7];
          auVar23 = vsubps_avx(auVar83,auVar107._0_32_);
          auVar27._4_4_ = auVar112._4_4_ * auVar23._4_4_;
          auVar27._0_4_ = auVar112._0_4_ * auVar23._0_4_;
          auVar27._8_4_ = auVar112._8_4_ * auVar23._8_4_;
          auVar27._12_4_ = auVar112._12_4_ * auVar23._12_4_;
          auVar27._16_4_ = auVar112._16_4_ * auVar23._16_4_;
          auVar27._20_4_ = auVar112._20_4_ * auVar23._20_4_;
          auVar27._24_4_ = auVar112._24_4_ * auVar23._24_4_;
          auVar27._28_4_ = auVar23._28_4_;
          pfVar3 = (float *)(uVar34 + 0x100 + (uVar48 ^ 0x20));
          auVar23 = vminps_avx(auVar128._0_32_,auVar27);
          pfVar1 = (float *)(uVar34 + 0x40 + (uVar48 ^ 0x20));
          auVar92._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar92._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar92._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar92._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar92._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar92._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar92._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar92._28_4_ = auVar82._28_4_ + pfVar1[7];
          auVar82 = vsubps_avx(auVar92,auVar108._0_32_);
          pfVar3 = (float *)(uVar34 + 0x100 + (uVar39 ^ 0x20));
          pfVar1 = (float *)(uVar34 + 0x40 + (uVar39 ^ 0x20));
          auVar102._0_4_ = fVar50 * *pfVar3 + *pfVar1;
          auVar102._4_4_ = fVar50 * pfVar3[1] + pfVar1[1];
          auVar102._8_4_ = fVar50 * pfVar3[2] + pfVar1[2];
          auVar102._12_4_ = fVar50 * pfVar3[3] + pfVar1[3];
          auVar102._16_4_ = fVar50 * pfVar3[4] + pfVar1[4];
          auVar102._20_4_ = fVar50 * pfVar3[5] + pfVar1[5];
          auVar102._24_4_ = fVar50 * pfVar3[6] + pfVar1[6];
          auVar102._28_4_ = auVar103._28_4_ + pfVar1[7];
          auVar28._4_4_ = auVar120._4_4_ * auVar82._4_4_;
          auVar28._0_4_ = auVar120._0_4_ * auVar82._0_4_;
          auVar28._8_4_ = auVar120._8_4_ * auVar82._8_4_;
          auVar28._12_4_ = auVar120._12_4_ * auVar82._12_4_;
          auVar28._16_4_ = auVar120._16_4_ * auVar82._16_4_;
          auVar28._20_4_ = auVar120._20_4_ * auVar82._20_4_;
          auVar28._24_4_ = auVar120._24_4_ * auVar82._24_4_;
          auVar28._28_4_ = auVar82._28_4_;
          auVar82 = vsubps_avx(auVar102,auVar110._0_32_);
          auVar29._4_4_ = auVar125._4_4_ * auVar82._4_4_;
          auVar29._0_4_ = auVar125._0_4_ * auVar82._0_4_;
          auVar29._8_4_ = auVar125._8_4_ * auVar82._8_4_;
          auVar29._12_4_ = auVar125._12_4_ * auVar82._12_4_;
          auVar29._16_4_ = auVar125._16_4_ * auVar82._16_4_;
          auVar29._20_4_ = auVar125._20_4_ * auVar82._20_4_;
          auVar29._24_4_ = auVar125._24_4_ * auVar82._24_4_;
          auVar29._28_4_ = auVar82._28_4_;
          auVar103 = ZEXT3264(auVar29);
          auVar82 = vminps_avx(auVar28,auVar29);
          auVar93 = ZEXT3264(auVar82);
          auVar23 = vminps_avx(auVar23,auVar82);
          auVar70 = vcmpps_avx(auVar70,auVar23,2);
          auVar71 = ZEXT3264(auVar70);
          if (((uint)uVar49 & 7) == 6) {
            auVar23 = vcmpps_avx(*(undefined1 (*) [32])(uVar34 + 0x1c0),auVar56,2);
            auVar82 = vcmpps_avx(auVar56,*(undefined1 (*) [32])(uVar34 + 0x1e0),1);
            auVar82 = vandps_avx(auVar23,auVar82);
            auVar70 = vandps_avx(auVar82,auVar70);
            auVar71 = ZEXT1664(auVar70._16_16_);
            auVar51 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          }
          else {
            auVar51 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          }
          auVar84 = ZEXT3264(auVar23);
          auVar51 = vpsllw_avx(auVar51,0xf);
          if ((((((((auVar51 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar51 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar51 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar51 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar51[0xf]) {
            if (local_1478 == &local_11d8) {
              return;
            }
            goto LAB_002e70c5;
          }
          auVar51 = vpacksswb_avx(auVar51,auVar51);
          bVar24 = SUB161(auVar51 >> 7,0) & 1 | (SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar51 >> 0x17,0) & 1) << 2 | (SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar51 >> 0x27,0) & 1) << 4 | (SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar51 >> 0x37,0) & 1) << 6 | SUB161(auVar51 >> 0x3f,0) << 7;
          lVar7 = 0;
          if (bVar24 != 0) {
            for (; (bVar24 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar49 = *(ulong *)(uVar34 + lVar7 * 8);
          uVar37 = bVar24 - 1 & (uint)bVar24;
          if (uVar37 != 0) {
            *local_1478 = uVar49;
            local_1478 = local_1478 + 1;
            lVar7 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar49 = *(ulong *)(uVar34 + lVar7 * 8);
            uVar37 = uVar37 - 1 & uVar37;
            uVar35 = (ulong)uVar37;
            if (uVar37 != 0) {
              do {
                *local_1478 = uVar49;
                local_1478 = local_1478 + 1;
                lVar7 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar49 = *(ulong *)(uVar34 + lVar7 * 8);
                uVar35 = uVar35 & uVar35 - 1;
              } while (uVar35 != 0);
            }
          }
        }
        local_1470 = (ulong)((uint)uVar49 & 0xf) - 8;
        if (local_1470 != 0) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          local_14a8 = context->scene;
          local_14a0 = 0;
          do {
            lVar46 = local_14a0 * 0x50;
            pGVar6 = (local_14a8->geometries).items[*(uint *)(uVar49 + 0x30 + lVar46)].ptr;
            fVar50 = (pGVar6->time_range).lower;
            fVar50 = pGVar6->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar50) / ((pGVar6->time_range).upper - fVar50))
            ;
            auVar51 = vroundss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),9);
            auVar51 = vminss_avx(auVar51,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
            auVar63 = vmaxss_avx(auVar105._0_16_,auVar51);
            lVar36 = (long)(int)auVar63._0_4_ * 0x38;
            uVar47 = (ulong)*(uint *)(uVar49 + 4 + lVar46);
            lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar36);
            lVar36 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar36);
            auVar51 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar49 + lVar46) * 4);
            uVar34 = (ulong)*(uint *)(uVar49 + 0x10 + lVar46);
            auVar54 = *(undefined1 (*) [16])(lVar7 + uVar34 * 4);
            uVar35 = (ulong)*(uint *)(uVar49 + 0x20 + lVar46);
            auVar65 = *(undefined1 (*) [16])(lVar7 + uVar35 * 4);
            auVar98 = *(undefined1 (*) [16])(lVar7 + uVar47 * 4);
            uVar40 = (ulong)*(uint *)(uVar49 + 0x14 + lVar46);
            auVar73 = *(undefined1 (*) [16])(lVar7 + uVar40 * 4);
            uVar41 = (ulong)*(uint *)(uVar49 + 0x24 + lVar46);
            auVar66 = *(undefined1 (*) [16])(lVar7 + uVar41 * 4);
            uVar42 = (ulong)*(uint *)(uVar49 + 8 + lVar46);
            auVar74 = *(undefined1 (*) [16])(lVar7 + uVar42 * 4);
            local_1460 = (ulong)*(uint *)(uVar49 + 0x18 + lVar46);
            auVar99 = *(undefined1 (*) [16])(lVar7 + local_1460 * 4);
            uVar43 = (ulong)*(uint *)(uVar49 + 0x28 + lVar46);
            auVar52 = *(undefined1 (*) [16])(lVar7 + uVar43 * 4);
            uVar44 = (ulong)*(uint *)(uVar49 + 0xc + lVar46);
            auVar53 = *(undefined1 (*) [16])(lVar7 + uVar44 * 4);
            local_1468 = (ulong)*(uint *)(uVar49 + 0x1c + lVar46);
            auVar55 = *(undefined1 (*) [16])(lVar7 + local_1468 * 4);
            uVar38 = (ulong)*(uint *)(uVar49 + 0x2c + lVar46);
            auVar61 = *(undefined1 (*) [16])(lVar7 + uVar38 * 4);
            auVar60 = *(undefined1 (*) [16])(lVar36 + (ulong)*(uint *)(uVar49 + lVar46) * 4);
            auVar62 = *(undefined1 (*) [16])(lVar36 + uVar34 * 4);
            fVar50 = fVar50 - auVar63._0_4_;
            auVar63 = vunpcklps_avx(auVar51,auVar74);
            auVar74 = vunpckhps_avx(auVar51,auVar74);
            auVar64 = vunpcklps_avx(auVar98,auVar53);
            auVar98 = vunpckhps_avx(auVar98,auVar53);
            auVar51 = *(undefined1 (*) [16])(lVar36 + uVar47 * 4);
            _local_13d8 = vunpcklps_avx(auVar74,auVar98);
            auVar32 = _local_13d8;
            auVar53 = vunpcklps_avx(auVar63,auVar64);
            auVar74 = vunpckhps_avx(auVar63,auVar64);
            auVar63 = vunpcklps_avx(auVar54,auVar99);
            auVar98 = vunpckhps_avx(auVar54,auVar99);
            auVar99 = vunpcklps_avx(auVar73,auVar55);
            auVar73 = vunpckhps_avx(auVar73,auVar55);
            auVar54 = *(undefined1 (*) [16])(lVar36 + uVar42 * 4);
            auVar55 = vunpcklps_avx(auVar98,auVar73);
            auVar64 = vunpcklps_avx(auVar63,auVar99);
            _local_13e8 = vunpckhps_avx(auVar63,auVar99);
            auVar31 = _local_13e8;
            auVar63 = vunpcklps_avx(auVar65,auVar52);
            auVar73 = vunpckhps_avx(auVar65,auVar52);
            auVar52 = vunpcklps_avx(auVar66,auVar61);
            auVar99 = vunpckhps_avx(auVar66,auVar61);
            auVar98 = *(undefined1 (*) [16])(lVar36 + uVar44 * 4);
            auVar61 = vunpcklps_avx(auVar73,auVar99);
            _local_13c8 = vunpcklps_avx(auVar63,auVar52);
            auVar33 = _local_13c8;
            _local_1498 = vunpckhps_avx(auVar63,auVar52);
            auVar30 = _local_1498;
            auVar73 = vunpcklps_avx(auVar60,auVar54);
            auVar54 = vunpckhps_avx(auVar60,auVar54);
            auVar99 = vunpcklps_avx(auVar51,auVar98);
            auVar98 = vunpckhps_avx(auVar51,auVar98);
            auVar51 = *(undefined1 (*) [16])(lVar36 + local_1460 * 4);
            auVar52 = vunpcklps_avx(auVar54,auVar98);
            auVar60 = vunpcklps_avx(auVar73,auVar99);
            auVar98 = vunpckhps_avx(auVar73,auVar99);
            auVar99 = vunpcklps_avx(auVar62,auVar51);
            auVar73 = vunpckhps_avx(auVar62,auVar51);
            auVar51 = *(undefined1 (*) [16])(lVar36 + uVar40 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar36 + local_1468 * 4);
            auVar62 = vunpcklps_avx(auVar51,auVar54);
            auVar51 = vunpckhps_avx(auVar51,auVar54);
            auVar63 = vunpcklps_avx(auVar73,auVar51);
            auVar65 = vunpcklps_avx(auVar99,auVar62);
            auVar73 = vunpckhps_avx(auVar99,auVar62);
            auVar51 = *(undefined1 (*) [16])(lVar36 + uVar35 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar36 + uVar43 * 4);
            auVar62 = vunpcklps_avx(auVar51,auVar54);
            auVar99 = vunpckhps_avx(auVar51,auVar54);
            auVar51 = *(undefined1 (*) [16])(lVar36 + uVar41 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar36 + uVar38 * 4);
            auVar66 = vunpcklps_avx(auVar51,auVar54);
            auVar51 = vunpckhps_avx(auVar51,auVar54);
            auVar67 = vunpcklps_avx(auVar99,auVar51);
            auVar76 = vunpcklps_avx(auVar62,auVar66);
            auVar99 = vunpckhps_avx(auVar62,auVar66);
            auVar51 = vshufps_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),0);
            auVar54 = vshufps_avx(ZEXT416((uint)(1.0 - fVar50)),ZEXT416((uint)(1.0 - fVar50)),0);
            fVar50 = auVar51._0_4_;
            fVar57 = auVar51._4_4_;
            fVar58 = auVar51._8_4_;
            fVar59 = auVar51._12_4_;
            fVar96 = auVar54._0_4_;
            fVar129 = auVar54._4_4_;
            fVar130 = auVar54._8_4_;
            fVar131 = auVar54._12_4_;
            auVar104._0_4_ = fVar96 * auVar53._0_4_ + fVar50 * auVar60._0_4_;
            auVar104._4_4_ = fVar129 * auVar53._4_4_ + fVar57 * auVar60._4_4_;
            auVar104._8_4_ = fVar130 * auVar53._8_4_ + fVar58 * auVar60._8_4_;
            auVar104._12_4_ = fVar131 * auVar53._12_4_ + fVar59 * auVar60._12_4_;
            auVar106._0_4_ = fVar96 * auVar74._0_4_ + fVar50 * auVar98._0_4_;
            auVar106._4_4_ = fVar129 * auVar74._4_4_ + fVar57 * auVar98._4_4_;
            auVar106._8_4_ = fVar130 * auVar74._8_4_ + fVar58 * auVar98._8_4_;
            auVar106._12_4_ = fVar131 * auVar74._12_4_ + fVar59 * auVar98._12_4_;
            auVar100._0_4_ = fVar96 * (float)local_13d8._0_4_ + fVar50 * auVar52._0_4_;
            auVar100._4_4_ = fVar129 * (float)local_13d8._4_4_ + fVar57 * auVar52._4_4_;
            auVar100._8_4_ = fVar130 * fStack_13d0 + fVar58 * auVar52._8_4_;
            auVar100._12_4_ = fVar131 * fStack_13cc + fVar59 * auVar52._12_4_;
            auVar60._0_4_ = fVar96 * auVar64._0_4_ + fVar50 * auVar65._0_4_;
            auVar60._4_4_ = fVar129 * auVar64._4_4_ + fVar57 * auVar65._4_4_;
            auVar60._8_4_ = fVar130 * auVar64._8_4_ + fVar58 * auVar65._8_4_;
            auVar60._12_4_ = fVar131 * auVar64._12_4_ + fVar59 * auVar65._12_4_;
            auVar75._0_4_ = fVar96 * (float)local_13e8._0_4_ + fVar50 * auVar73._0_4_;
            auVar75._4_4_ = fVar129 * (float)local_13e8._4_4_ + fVar57 * auVar73._4_4_;
            auVar75._8_4_ = fVar130 * fStack_13e0 + fVar58 * auVar73._8_4_;
            auVar75._12_4_ = fVar131 * fStack_13dc + fVar59 * auVar73._12_4_;
            puVar2 = (undefined8 *)(uVar49 + 0x30 + lVar46);
            local_13a8 = *puVar2;
            uStack_13a0 = puVar2[1];
            puVar2 = (undefined8 *)(uVar49 + 0x40 + lVar46);
            local_14c8._0_4_ = auVar55._0_4_;
            local_14c8._4_4_ = auVar55._4_4_;
            fStack_14c0 = auVar55._8_4_;
            fStack_14bc = auVar55._12_4_;
            auVar109._0_4_ = fVar96 * (float)local_14c8._0_4_ + auVar63._0_4_ * fVar50;
            auVar109._4_4_ = fVar129 * (float)local_14c8._4_4_ + auVar63._4_4_ * fVar57;
            auVar109._8_4_ = fVar130 * fStack_14c0 + auVar63._8_4_ * fVar58;
            auVar109._12_4_ = fVar131 * fStack_14bc + auVar63._12_4_ * fVar59;
            auVar124._0_4_ = fVar96 * (float)local_13c8._0_4_ + auVar76._0_4_ * fVar50;
            auVar124._4_4_ = fVar129 * (float)local_13c8._4_4_ + auVar76._4_4_ * fVar57;
            auVar124._8_4_ = fVar130 * fStack_13c0 + auVar76._8_4_ * fVar58;
            auVar124._12_4_ = fVar131 * fStack_13bc + auVar76._12_4_ * fVar59;
            auVar126._0_4_ = auVar99._0_4_ * fVar50 + fVar96 * (float)local_1498._0_4_;
            auVar126._4_4_ = auVar99._4_4_ * fVar57 + fVar129 * (float)local_1498._4_4_;
            auVar126._8_4_ = auVar99._8_4_ * fVar58 + fVar130 * fStack_1490;
            auVar126._12_4_ = auVar99._12_4_ * fVar59 + fVar131 * fStack_148c;
            local_14d8._0_4_ = auVar61._0_4_;
            local_14d8._4_4_ = auVar61._4_4_;
            fStack_14d0 = auVar61._8_4_;
            fStack_14cc = auVar61._12_4_;
            auVar52._0_4_ = fVar96 * (float)local_14d8._0_4_ + auVar67._0_4_ * fVar50;
            auVar52._4_4_ = fVar129 * (float)local_14d8._4_4_ + auVar67._4_4_ * fVar57;
            auVar52._8_4_ = fVar130 * fStack_14d0 + auVar67._8_4_ * fVar58;
            auVar52._12_4_ = fVar131 * fStack_14cc + auVar67._12_4_ * fVar59;
            local_13b8 = *puVar2;
            uStack_13b0 = puVar2[1];
            auVar51 = vsubps_avx(auVar104,auVar60);
            auVar54 = vsubps_avx(auVar106,auVar75);
            auVar98 = vsubps_avx(auVar100,auVar109);
            auVar73 = vsubps_avx(auVar124,auVar104);
            auVar74 = vsubps_avx(auVar126,auVar106);
            auVar99 = vsubps_avx(auVar52,auVar100);
            fVar59 = auVar99._0_4_;
            fVar111 = auVar54._0_4_;
            auVar53._0_4_ = fVar111 * fVar59;
            fVar8 = auVar99._4_4_;
            fVar113 = auVar54._4_4_;
            auVar53._4_4_ = fVar113 * fVar8;
            fVar13 = auVar99._8_4_;
            fVar115 = auVar54._8_4_;
            auVar53._8_4_ = fVar115 * fVar13;
            fVar18 = auVar99._12_4_;
            fVar117 = auVar54._12_4_;
            auVar53._12_4_ = fVar117 * fVar18;
            fVar96 = auVar74._0_4_;
            fVar119 = auVar98._0_4_;
            auVar61._0_4_ = fVar119 * fVar96;
            fVar9 = auVar74._4_4_;
            fVar121 = auVar98._4_4_;
            auVar61._4_4_ = fVar121 * fVar9;
            fVar14 = auVar74._8_4_;
            fVar122 = auVar98._8_4_;
            auVar61._8_4_ = fVar122 * fVar14;
            fVar19 = auVar74._12_4_;
            fVar123 = auVar98._12_4_;
            auVar61._12_4_ = fVar123 * fVar19;
            local_14e8 = vsubps_avx(auVar61,auVar53);
            fVar129 = auVar73._0_4_;
            auVar62._0_4_ = fVar119 * fVar129;
            fVar10 = auVar73._4_4_;
            auVar62._4_4_ = fVar121 * fVar10;
            fVar15 = auVar73._8_4_;
            auVar62._8_4_ = fVar122 * fVar15;
            fVar20 = auVar73._12_4_;
            auVar62._12_4_ = fVar123 * fVar20;
            fVar130 = auVar51._0_4_;
            auVar76._0_4_ = fVar59 * fVar130;
            fVar11 = auVar51._4_4_;
            auVar76._4_4_ = fVar8 * fVar11;
            fVar16 = auVar51._8_4_;
            auVar76._8_4_ = fVar13 * fVar16;
            fVar21 = auVar51._12_4_;
            auVar76._12_4_ = fVar18 * fVar21;
            auVar98 = vsubps_avx(auVar76,auVar62);
            auVar77._0_4_ = fVar96 * fVar130;
            auVar77._4_4_ = fVar9 * fVar11;
            auVar77._8_4_ = fVar14 * fVar16;
            auVar77._12_4_ = fVar19 * fVar21;
            auVar89._0_4_ = fVar111 * fVar129;
            auVar89._4_4_ = fVar113 * fVar10;
            auVar89._8_4_ = fVar115 * fVar15;
            auVar89._12_4_ = fVar117 * fVar20;
            local_14f8 = vsubps_avx(auVar89,auVar77);
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar90._4_4_ = uVar4;
            auVar90._0_4_ = uVar4;
            auVar90._8_4_ = uVar4;
            auVar90._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar54._4_4_ = uVar4;
            auVar54._0_4_ = uVar4;
            auVar54._8_4_ = uVar4;
            auVar54._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar132._4_4_ = uVar4;
            auVar132._0_4_ = uVar4;
            auVar132._8_4_ = uVar4;
            auVar132._12_4_ = uVar4;
            fVar50 = (ray->dir).field_0.m128[1];
            local_14b8 = vsubps_avx(auVar104,auVar90);
            fVar57 = (ray->dir).field_0.m128[2];
            _local_14c8 = vsubps_avx(auVar106,auVar54);
            auVar93 = ZEXT1664(_local_14c8);
            _local_14d8 = vsubps_avx(auVar100,auVar132);
            fVar131 = local_14d8._0_4_;
            auVar101._0_4_ = fVar50 * fVar131;
            fVar12 = local_14d8._4_4_;
            auVar101._4_4_ = fVar50 * fVar12;
            fVar17 = local_14d8._8_4_;
            auVar101._8_4_ = fVar50 * fVar17;
            fVar22 = local_14d8._12_4_;
            auVar101._12_4_ = fVar50 * fVar22;
            fVar88 = local_14c8._0_4_;
            auVar133._0_4_ = fVar88 * fVar57;
            fVar94 = local_14c8._4_4_;
            auVar133._4_4_ = fVar94 * fVar57;
            fVar95 = local_14c8._8_4_;
            auVar133._8_4_ = fVar95 * fVar57;
            fVar97 = local_14c8._12_4_;
            auVar133._12_4_ = fVar97 * fVar57;
            auVar54 = vsubps_avx(auVar133,auVar101);
            fVar58 = (ray->dir).field_0.m128[0];
            fVar72 = local_14b8._0_4_;
            auVar55._0_4_ = fVar72 * fVar57;
            fVar85 = local_14b8._4_4_;
            auVar55._4_4_ = fVar85 * fVar57;
            fVar86 = local_14b8._8_4_;
            auVar55._8_4_ = fVar86 * fVar57;
            fVar87 = local_14b8._12_4_;
            auVar55._12_4_ = fVar87 * fVar57;
            auVar63._0_4_ = fVar131 * fVar58;
            auVar63._4_4_ = fVar12 * fVar58;
            auVar63._8_4_ = fVar17 * fVar58;
            auVar63._12_4_ = fVar22 * fVar58;
            auVar73 = vsubps_avx(auVar63,auVar55);
            auVar64._0_4_ = fVar88 * fVar58;
            auVar64._4_4_ = fVar94 * fVar58;
            auVar64._8_4_ = fVar95 * fVar58;
            auVar64._12_4_ = fVar97 * fVar58;
            auVar78._0_4_ = fVar50 * fVar72;
            auVar78._4_4_ = fVar50 * fVar85;
            auVar78._8_4_ = fVar50 * fVar86;
            auVar78._12_4_ = fVar50 * fVar87;
            auVar74 = vsubps_avx(auVar78,auVar64);
            auVar99 = local_14f8;
            auVar79._0_4_ =
                 local_14e8._0_4_ * fVar58 + fVar50 * auVar98._0_4_ + local_14f8._0_4_ * fVar57;
            auVar79._4_4_ =
                 local_14e8._4_4_ * fVar58 + fVar50 * auVar98._4_4_ + local_14f8._4_4_ * fVar57;
            auVar79._8_4_ =
                 local_14e8._8_4_ * fVar58 + fVar50 * auVar98._8_4_ + local_14f8._8_4_ * fVar57;
            auVar79._12_4_ =
                 local_14e8._12_4_ * fVar58 + fVar50 * auVar98._12_4_ + local_14f8._12_4_ * fVar57;
            auVar84 = ZEXT1664(auVar79);
            auVar65._8_8_ = 0x8000000080000000;
            auVar65._0_8_ = 0x8000000080000000;
            auVar51 = vandps_avx(auVar79,auVar65);
            uVar37 = auVar51._0_4_;
            local_1398._0_4_ =
                 (float)(uVar37 ^ (uint)(fVar129 * auVar54._0_4_ +
                                        fVar96 * auVar73._0_4_ + fVar59 * auVar74._0_4_));
            uVar114 = auVar51._4_4_;
            local_1398._4_4_ =
                 (float)(uVar114 ^
                        (uint)(fVar10 * auVar54._4_4_ +
                              fVar9 * auVar73._4_4_ + fVar8 * auVar74._4_4_));
            uVar116 = auVar51._8_4_;
            local_1398._8_4_ =
                 (float)(uVar116 ^
                        (uint)(fVar15 * auVar54._8_4_ +
                              fVar14 * auVar73._8_4_ + fVar13 * auVar74._8_4_));
            uVar118 = auVar51._12_4_;
            local_1398._12_4_ =
                 (float)(uVar118 ^
                        (uint)(fVar20 * auVar54._12_4_ +
                              fVar19 * auVar73._12_4_ + fVar18 * auVar74._12_4_));
            auVar103 = ZEXT1664(local_1398);
            local_1388._0_4_ =
                 (float)(uVar37 ^ (uint)(auVar54._0_4_ * fVar130 +
                                        fVar111 * auVar73._0_4_ + fVar119 * auVar74._0_4_));
            local_1388._4_4_ =
                 (float)(uVar114 ^
                        (uint)(auVar54._4_4_ * fVar11 +
                              fVar113 * auVar73._4_4_ + fVar121 * auVar74._4_4_));
            local_1388._8_4_ =
                 (float)(uVar116 ^
                        (uint)(auVar54._8_4_ * fVar16 +
                              fVar115 * auVar73._8_4_ + fVar122 * auVar74._8_4_));
            local_1388._12_4_ =
                 (float)(uVar118 ^
                        (uint)(auVar54._12_4_ * fVar21 +
                              fVar117 * auVar73._12_4_ + fVar123 * auVar74._12_4_));
            auVar73 = ZEXT816(0) << 0x20;
            auVar51 = vcmpps_avx(local_1398,auVar73,5);
            auVar54 = vcmpps_avx(local_1388,auVar73,5);
            auVar51 = vandps_avx(auVar51,auVar54);
            auVar66._8_4_ = 0x7fffffff;
            auVar66._0_8_ = 0x7fffffff7fffffff;
            auVar66._12_4_ = 0x7fffffff;
            local_1368 = vandps_avx(auVar79,auVar66);
            auVar54 = vcmpps_avx(auVar73,auVar79,4);
            auVar51 = vandps_avx(auVar51,auVar54);
            auVar67._0_4_ = local_1398._0_4_ + local_1388._0_4_;
            auVar67._4_4_ = local_1398._4_4_ + local_1388._4_4_;
            auVar67._8_4_ = local_1398._8_4_ + local_1388._8_4_;
            auVar67._12_4_ = local_1398._12_4_ + local_1388._12_4_;
            auVar54 = vcmpps_avx(auVar67,local_1368,2);
            auVar71 = ZEXT1664(auVar54);
            auVar51 = vandps_avx(auVar51,auVar54);
            auVar54 = local_13f8 & auVar51;
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              auVar51 = vandps_avx(auVar51,local_13f8);
              local_1378._0_4_ =
                   (float)(uVar37 ^ (uint)(local_14e8._0_4_ * fVar72 +
                                          fVar88 * auVar98._0_4_ + fVar131 * local_14f8._0_4_));
              local_1378._4_4_ =
                   (float)(uVar114 ^
                          (uint)(local_14e8._4_4_ * fVar85 +
                                fVar94 * auVar98._4_4_ + fVar12 * local_14f8._4_4_));
              local_1378._8_4_ =
                   (float)(uVar116 ^
                          (uint)(local_14e8._8_4_ * fVar86 +
                                fVar95 * auVar98._8_4_ + fVar17 * local_14f8._8_4_));
              local_1378._12_4_ =
                   (float)(uVar118 ^
                          (uint)(local_14e8._12_4_ * fVar87 +
                                fVar97 * auVar98._12_4_ + fVar22 * local_14f8._12_4_));
              auVar93 = ZEXT1664(local_1378);
              fVar50 = (ray->org).field_0.m128[3];
              fVar57 = local_1368._0_4_;
              auVar68._0_4_ = fVar57 * fVar50;
              fVar58 = local_1368._4_4_;
              auVar68._4_4_ = fVar58 * fVar50;
              fVar59 = local_1368._8_4_;
              auVar68._8_4_ = fVar59 * fVar50;
              fVar96 = local_1368._12_4_;
              auVar68._12_4_ = fVar96 * fVar50;
              auVar54 = vcmpps_avx(auVar68,local_1378,1);
              fVar50 = ray->tfar;
              auVar80._0_4_ = fVar57 * fVar50;
              auVar80._4_4_ = fVar58 * fVar50;
              auVar80._8_4_ = fVar59 * fVar50;
              auVar80._12_4_ = fVar96 * fVar50;
              auVar73 = vcmpps_avx(local_1378,auVar80,2);
              auVar84 = ZEXT1664(auVar73);
              auVar54 = vandps_avx(auVar73,auVar54);
              auVar71 = ZEXT1664(auVar54);
              local_1348 = vandps_avx(auVar54,auVar51);
              uVar37 = vmovmskps_avx(local_1348);
              if (uVar37 != 0) {
                local_1308 = local_14e8;
                local_1528 = auVar98._0_8_;
                uStack_1520 = auVar98._8_8_;
                local_12f8 = local_1528;
                uStack_12f0 = uStack_1520;
                local_12e8 = local_14f8._0_8_;
                uStack_12e0 = local_14f8._8_8_;
                auVar51 = vrcpps_avx(local_1368);
                fVar50 = auVar51._0_4_;
                auVar69._0_4_ = fVar57 * fVar50;
                fVar57 = auVar51._4_4_;
                auVar69._4_4_ = fVar58 * fVar57;
                fVar58 = auVar51._8_4_;
                auVar69._8_4_ = fVar59 * fVar58;
                fVar59 = auVar51._12_4_;
                auVar69._12_4_ = fVar96 * fVar59;
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = 0x3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar84 = ZEXT1664(auVar81);
                auVar51 = vsubps_avx(auVar81,auVar69);
                fVar50 = fVar50 + fVar50 * auVar51._0_4_;
                fVar57 = fVar57 + fVar57 * auVar51._4_4_;
                fVar58 = fVar58 + fVar58 * auVar51._8_4_;
                fVar59 = fVar59 + fVar59 * auVar51._12_4_;
                local_1318[0] = fVar50 * local_1378._0_4_;
                local_1318[1] = fVar57 * local_1378._4_4_;
                local_1318[2] = fVar58 * local_1378._8_4_;
                local_1318[3] = fVar59 * local_1378._12_4_;
                local_1338._0_4_ = fVar50 * local_1398._0_4_;
                local_1338._4_4_ = fVar57 * local_1398._4_4_;
                local_1338._8_4_ = fVar58 * local_1398._8_4_;
                local_1338._12_4_ = fVar59 * local_1398._12_4_;
                auVar71 = ZEXT1664(local_1338);
                local_1328._0_4_ = fVar50 * local_1388._0_4_;
                local_1328._4_4_ = fVar57 * local_1388._4_4_;
                local_1328._8_4_ = fVar58 * local_1388._8_4_;
                local_1328._12_4_ = fVar59 * local_1388._12_4_;
                uVar38 = (ulong)(uVar37 & 0xff);
                local_14f8 = auVar99;
                _local_1498 = auVar30;
                _local_13e8 = auVar31;
                _local_13d8 = auVar32;
                _local_13c8 = auVar33;
                do {
                  uVar34 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                    }
                  }
                  local_1440 = *(uint *)((long)&local_13a8 + uVar34 * 4);
                  pGVar6 = (local_14a8->geometries).items[local_1440].ptr;
                  if ((pGVar6->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e7afb;
                    local_14e8._0_8_ = context->args;
                    local_1428.context = context->user;
                    local_1458 = *(uint *)(local_1308 + uVar34 * 4);
                    auVar51 = ZEXT416(local_1458);
                    local_1454 = *(uint *)((long)&local_12f8 + uVar34 * 4);
                    auVar54 = ZEXT416(local_1454);
                    local_1450 = *(uint *)((long)&local_12e8 + uVar34 * 4);
                    auVar98 = ZEXT416(local_1450);
                    local_144c = *(undefined4 *)(local_1338 + uVar34 * 4);
                    local_1448 = local_1318[uVar34 - 4];
                    local_1444 = *(undefined4 *)((long)&local_13b8 + uVar34 * 4);
                    local_143c = (local_1428.context)->instID[0];
                    local_1438 = (local_1428.context)->instPrimID[0];
                    local_14b8._0_4_ = ray->tfar;
                    local_14f8._0_8_ = uVar34;
                    ray->tfar = local_1318[uVar34];
                    local_14fc = -1;
                    local_1428.valid = &local_14fc;
                    local_1428.geometryUserPtr = pGVar6->userPtr;
                    local_1428.hit = (RTCHitN *)&local_1458;
                    local_1428.N = 1;
                    local_14c8 = (undefined1  [8])pGVar6;
                    local_1428.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e79f8:
                      if ((*(code **)(local_14e8._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_14e8._0_8_ & 2) == 0 &&
                          ((*(byte *)((long)local_14c8 + 0x3e) & 0x40) == 0)))) {
LAB_002e7afb:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      auVar84 = ZEXT1664(auVar51);
                      auVar93 = ZEXT1664(auVar54);
                      auVar103 = ZEXT1664(auVar98);
                      (**(code **)(local_14e8._0_8_ + 0x10))(&local_1428);
                      auVar71._8_56_ = extraout_var_00;
                      auVar71._0_8_ = extraout_XMM1_Qa_00;
                      if (*local_1428.valid != 0) goto LAB_002e7afb;
                    }
                    else {
                      auVar84 = ZEXT464(local_1458);
                      auVar93 = ZEXT464(local_1454);
                      auVar103 = ZEXT464(local_1450);
                      (*pGVar6->occlusionFilterN)(&local_1428);
                      auVar98 = auVar103._0_16_;
                      auVar54 = auVar93._0_16_;
                      auVar51 = auVar84._0_16_;
                      auVar71._8_56_ = extraout_var;
                      auVar71._0_8_ = extraout_XMM1_Qa;
                      if (*local_1428.valid != 0) goto LAB_002e79f8;
                    }
                    ray->tfar = (float)local_14b8._0_4_;
                    uVar34 = local_14f8._0_8_;
                  }
                  uVar38 = uVar38 ^ 1L << (uVar34 & 0x3f);
                } while (uVar38 != 0);
              }
            }
            local_14a0 = local_14a0 + 1;
            auVar105 = ZEXT1664(ZEXT816(0) << 0x40);
          } while (local_14a0 != local_1470);
        }
        auVar107 = ZEXT3264(local_11f8);
        auVar108 = ZEXT3264(local_1218);
        auVar110 = ZEXT3264(local_1238);
        auVar112 = ZEXT3264(local_1258);
        auVar120 = ZEXT3264(local_1278);
        auVar125 = ZEXT3264(local_1298);
        auVar127 = ZEXT3264(local_12b8);
        auVar128 = ZEXT3264(local_12d8);
        uVar38 = local_1480;
      } while (local_1478 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }